

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

int PHYSFS_stat(char *_fname,PHYSFS_Stat *stat)

{
  long *dst;
  DirHandle *h;
  void *pvVar1;
  _func_int_void_ptr_char_ptr_PHYSFS_Stat_ptr *p_Var2;
  long *plVar3;
  int iVar4;
  long *in_RAX;
  size_t sVar5;
  long *plVar6;
  long lVar7;
  ErrState *pEVar8;
  void **retval;
  long **pplVar9;
  PHYSFS_ErrorCode errcode;
  __PHYSFS_DIRHANDLE__ *h_00;
  long *local_38;
  char *arcfname;
  
  pplVar9 = &local_38;
  if ((_fname == (char *)0x0) || (stat == (PHYSFS_Stat *)0x0)) {
    errcode = PHYSFS_ERR_INVALID_ARGUMENT;
LAB_00109021:
    PHYSFS_setErrorCode(errcode);
    iVar4 = 0;
  }
  else {
    local_38 = in_RAX;
    sVar5 = strlen(_fname);
    if (sVar5 + 1 < 0x100) {
      plVar6 = (long *)((long)&local_38 - (sVar5 + 0x18 & 0xfffffffffffffff0));
      lVar7 = 0;
      pplVar9 = (long **)plVar6;
    }
    else {
      plVar6 = (long *)(*__PHYSFS_AllocatorHooks.Malloc)(sVar5 + 9);
      if (plVar6 == (long *)0x0) {
        errcode = PHYSFS_ERR_OUT_OF_MEMORY;
        goto LAB_00109021;
      }
      lVar7 = 1;
    }
    *plVar6 = lVar7;
    dst = plVar6 + 1;
    *(undefined4 *)&stat->createtime = 0xffffffff;
    *(undefined4 *)((long)&stat->createtime + 4) = 0xffffffff;
    *(undefined4 *)&stat->accesstime = 0xffffffff;
    *(undefined4 *)((long)&stat->accesstime + 4) = 0xffffffff;
    *(undefined4 *)&stat->filesize = 0xffffffff;
    *(undefined4 *)((long)&stat->filesize + 4) = 0xffffffff;
    *(undefined4 *)&stat->modtime = 0xffffffff;
    *(undefined4 *)((long)&stat->modtime + 4) = 0xffffffff;
    stat->filetype = PHYSFS_FILETYPE_OTHER;
    stat->readonly = 1;
    ((long *)pplVar9)[-1] = 0x10907b;
    iVar4 = sanitizePlatformIndependentPath(_fname,(char *)dst);
    if (iVar4 == 0) {
      iVar4 = 0;
    }
    else if ((char)*dst == '\0') {
      stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
      stat->readonly = (uint)(writeDir == (DirHandle *)0x0);
      iVar4 = 1;
    }
    else {
      ((long *)pplVar9)[-1] = 0x109091;
      __PHYSFS_platformGrabMutex(stateLock);
      for (h_00 = searchPath; h_00 != (DirHandle *)0x0; h_00 = h_00->next) {
        h = (DirHandle *)h_00->mountPoint;
        local_38 = dst;
        ((long *)pplVar9)[-1] = 0x1090b1;
        iVar4 = partOfMountPoint(h,(char *)dst);
        if (iVar4 != 0) {
          stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
          stat->readonly = 1;
          iVar4 = 1;
          goto LAB_00109144;
        }
        ((long *)pplVar9)[-1] = 0x1090c3;
        iVar4 = verifyPath(h_00,(char **)&local_38,0);
        plVar3 = local_38;
        if (iVar4 != 0) {
          pvVar1 = h_00->opaque;
          p_Var2 = h_00->funcs->stat;
          ((long *)pplVar9)[-1] = 0x1090d9;
          iVar4 = (*p_Var2)(pvVar1,(char *)plVar3,stat);
          if (iVar4 != 0) goto LAB_00109144;
          ((long *)pplVar9)[-1] = 0x1090e2;
          pEVar8 = findErrorForCurrentThread();
          iVar4 = 0;
          if ((pEVar8 == (ErrState *)0x0) || (pEVar8->code != PHYSFS_ERR_NOT_FOUND))
          goto LAB_00109144;
        }
      }
      iVar4 = 0;
LAB_00109144:
      ((long *)pplVar9)[-1] = 0x109150;
      __PHYSFS_platformReleaseMutex(stateLock);
    }
    if (*plVar6 != 0) {
      ((long *)pplVar9)[-1] = 0x10915f;
      (*__PHYSFS_AllocatorHooks.Free)(plVar6);
    }
  }
  return iVar4;
}

Assistant:

int PHYSFS_stat(const char *_fname, PHYSFS_Stat *stat)
{
    int retval = 0;
    char *fname;
    size_t len;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!stat, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    len = strlen(_fname) + 1;
    fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF(!fname, PHYSFS_ERR_OUT_OF_MEMORY, 0);

    /* set some sane defaults... */
    stat->filesize = -1;
    stat->modtime = -1;
    stat->createtime = -1;
    stat->accesstime = -1;
    stat->filetype = PHYSFS_FILETYPE_OTHER;
    stat->readonly = 1;

    if (sanitizePlatformIndependentPath(_fname, fname))
    {
        if (*fname == '\0')
        {
            stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
            stat->readonly = !writeDir; /* Writeable if we have a writeDir */
            retval = 1;
        } /* if */
        else
        {
            DirHandle *i;
            int exists = 0;
            __PHYSFS_platformGrabMutex(stateLock);
            for (i = searchPath; ((i != NULL) && (!exists)); i = i->next)
            {
                char *arcfname = fname;
                exists = partOfMountPoint(i, arcfname);
                if (exists)
                {
                    stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
                    stat->readonly = 1;
                    retval = 1;
                } /* if */
                else if (verifyPath(i, &arcfname, 0))
                {
                    retval = i->funcs->stat(i->opaque, arcfname, stat);
                    if ((retval) || (currentErrorCode() != PHYSFS_ERR_NOT_FOUND))
                        exists = 1;
                } /* else if */
            } /* for */
            __PHYSFS_platformReleaseMutex(stateLock);
        } /* else */
    } /* if */

    __PHYSFS_smallFree(fname);
    return retval;
}